

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupMockPlugin::TEST_GROUP_CppUTestGroupMockPlugin
          (TEST_GROUP_CppUTestGroupMockPlugin *this)

{
  SimpleString SStack_28;
  
  Utest::Utest(&this->super_Utest);
  (this->super_Utest)._vptr_Utest = (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockPlugin_002d4c70;
  StringBufferTestOutput::StringBufferTestOutput(&this->output);
  SimpleString::SimpleString(&SStack_28,"MockSupportPLugin");
  MockSupportPlugin::MockSupportPlugin(&this->plugin,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  return;
}

Assistant:

TEST_GROUP(MockPlugin)
{
    StringBufferTestOutput output;

    UtestShell *test;
    TestResult *result;

    MockSupportPlugin plugin;

    void setup() _override
    {
        test = new UtestShell("group", "name", "file", 1);
        result = new TestResult(output);
    }

    void teardown() _override
    {
        delete test;
        delete result;
        mock().clear();
        mock().removeAllComparatorsAndCopiers();
    }
}